

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

void mi_heap_collect_ex(mi_heap_t *heap,mi_collect_t collect)

{
  mi_threadid_t mVar1;
  mi_page_s *pmVar2;
  bool bVar3;
  _Bool _Var4;
  mi_threadid_t mVar5;
  mi_segment_t *pmVar6;
  mi_heap_t *pmVar7;
  mi_collect_t collect_1;
  long lVar8;
  mi_segment_t *segment;
  bool force;
  mi_page_t *pmVar9;
  size_t i;
  bool bVar10;
  
  if (heap == &_mi_heap_empty || heap == (mi_heap_t *)0x0) {
    return;
  }
  _mi_deferred_free(heap,collect != MI_NORMAL);
  _Var4 = _mi_is_main_thread();
  if (_Var4) {
    mVar1 = heap->thread_id;
    mVar5 = _mi_thread_id();
    bVar10 = mVar1 != mVar5;
    if (collect == MI_FORCE && !bVar10) {
      if ((heap->tld->heap_backing == heap) && (heap->no_reclaim == false)) {
        _mi_abandoned_reclaim_all(heap,&heap->tld->segments);
      }
      bVar3 = false;
      bVar10 = false;
      goto LAB_0049b7ee;
    }
  }
  else {
    bVar10 = true;
  }
  if (collect == MI_ABANDON) {
    bVar3 = true;
    if (heap->page_count != 0) {
      lVar8 = 0;
      do {
        pmVar9 = heap->pages[lVar8].first;
        while (pmVar9 != (mi_page_t *)0x0) {
          pmVar2 = pmVar9->next;
          _mi_page_use_delayed_free(pmVar9,MI_NEVER_DELAYED_FREE,false);
          pmVar9 = pmVar2;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x4b);
    }
  }
  else {
    bVar3 = false;
  }
LAB_0049b7ee:
  force = collect == MI_FORCE;
  _mi_heap_delayed_free_all(heap);
  _mi_heap_collect_retired(heap,collect != MI_NORMAL);
  if (heap->page_count != 0) {
    lVar8 = 0;
    do {
      pmVar9 = heap->pages[lVar8].first;
      if (pmVar9 != (mi_page_t *)0x0) {
        do {
          pmVar2 = pmVar9->next;
          _mi_page_free_collect(pmVar9,collect != MI_NORMAL);
          if (force) {
            pmVar6 = (mi_segment_t *)((ulong)((long)pmVar9[-1].padding + 7U) & 0xfffffffffe000000);
            segment = (mi_segment_t *)0x0;
            if (0 < (long)pmVar6) {
              segment = pmVar6;
            }
            _mi_segment_collect(segment,true);
            if (pmVar9->used == 0) {
LAB_0049b8af:
              _mi_page_free(pmVar9,heap->pages + lVar8,collect != MI_NORMAL);
            }
          }
          else {
            if (pmVar9->used == 0) goto LAB_0049b8af;
            if (bVar3) {
              _mi_page_abandon(pmVar9,heap->pages + lVar8);
            }
          }
          pmVar9 = pmVar2;
        } while (pmVar2 != (mi_page_s *)0x0);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x4b);
  }
  _mi_abandoned_collect(heap,force,&heap->tld->segments);
  if ((collect != MI_NORMAL && !bVar10) && (heap->tld->heap_backing == heap)) {
    _mi_thread_data_collect();
  }
  _mi_arenas_collect(force);
  if (MI_FORCE < collect) {
    return;
  }
  pmVar7 = mi_heap_get_default();
  mi_stats_merge_from(&pmVar7->tld->stats);
  return;
}

Assistant:

static void mi_heap_collect_ex(mi_heap_t* heap, mi_collect_t collect)
{
  if (heap==NULL || !mi_heap_is_initialized(heap)) return;

  const bool force = (collect >= MI_FORCE);
  _mi_deferred_free(heap, force);

  // python/cpython#112532: we may be called from a thread that is not the owner of the heap
  const bool is_main_thread = (_mi_is_main_thread() && heap->thread_id == _mi_thread_id());

  // note: never reclaim on collect but leave it to threads that need storage to reclaim
  const bool force_main =
    #ifdef NDEBUG
      collect == MI_FORCE
    #else
      collect >= MI_FORCE
    #endif
      && is_main_thread && mi_heap_is_backing(heap) && !heap->no_reclaim;

  if (force_main) {
    // the main thread is abandoned (end-of-program), try to reclaim all abandoned segments.
    // if all memory is freed by now, all segments should be freed.
    // note: this only collects in the current subprocess
    _mi_abandoned_reclaim_all(heap, &heap->tld->segments);
  }

  // if abandoning, mark all pages to no longer add to delayed_free
  if (collect == MI_ABANDON) {
    mi_heap_visit_pages(heap, &mi_heap_page_never_delayed_free, NULL, NULL);
  }

  // free all current thread delayed blocks.
  // (if abandoning, after this there are no more thread-delayed references into the pages.)
  _mi_heap_delayed_free_all(heap);

  // collect retired pages
  _mi_heap_collect_retired(heap, force);

  // collect all pages owned by this thread
  mi_heap_visit_pages(heap, &mi_heap_page_collect, &collect, NULL);
  mi_assert_internal( collect != MI_ABANDON || mi_atomic_load_ptr_acquire(mi_block_t,&heap->thread_delayed_free) == NULL );

  // collect abandoned segments (in particular, purge expired parts of segments in the abandoned segment list)
  // note: forced purge can be quite expensive if many threads are created/destroyed so we do not force on abandonment
  _mi_abandoned_collect(heap, collect == MI_FORCE /* force? */, &heap->tld->segments);

  // if forced, collect thread data cache on program-exit (or shared library unload)
  if (force && is_main_thread && mi_heap_is_backing(heap)) {
    _mi_thread_data_collect();  // collect thread data cache
  }

  // collect arenas (this is program wide so don't force purges on abandonment of threads)
  _mi_arenas_collect(collect == MI_FORCE /* force purge? */);

  // merge statistics
  if (collect <= MI_FORCE) {
    mi_stats_merge();
  }
}